

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O0

void Abc_SclDnsizePerform(SC_Lib *pLib,Abc_Ntk_t *pNtk,SC_SizePars *pPars)

{
  Abc_Ntk_t *local_28;
  Abc_Ntk_t *pNtkNew;
  SC_SizePars *pPars_local;
  Abc_Ntk_t *pNtk_local;
  SC_Lib *pLib_local;
  
  local_28 = pNtk;
  if (0 < pNtk->nBarBufs2) {
    local_28 = Abc_NtkDupDfsNoBarBufs(pNtk);
  }
  Abc_SclDnsizePerformInt(pLib,local_28,pPars);
  if (0 < pNtk->nBarBufs2) {
    Abc_SclTransferGates(pNtk,local_28);
  }
  if (0 < pNtk->nBarBufs2) {
    Abc_NtkDelete(local_28);
  }
  return;
}

Assistant:

void Abc_SclDnsizePerform( SC_Lib * pLib, Abc_Ntk_t * pNtk, SC_SizePars * pPars )
{
    Abc_Ntk_t * pNtkNew = pNtk;
    if ( pNtk->nBarBufs2 > 0 )
        pNtkNew = Abc_NtkDupDfsNoBarBufs( pNtk );
    Abc_SclDnsizePerformInt( pLib, pNtkNew, pPars );
    if ( pNtk->nBarBufs2 > 0 )
        Abc_SclTransferGates( pNtk, pNtkNew );
    if ( pNtk->nBarBufs2 > 0 )
        Abc_NtkDelete( pNtkNew );
}